

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  
  pbVar2 = (byte *)input->data_;
  sVar3 = input->size_;
  if ((long)sVar3 < 1) {
    pbVar6 = (byte *)0x0;
  }
  else if ((char)*pbVar2 < '\0') {
    pbVar6 = (byte *)0x0;
    uVar5 = 0;
    uVar8 = 0;
    pbVar4 = pbVar2;
    while( true ) {
      pbVar7 = pbVar4 + 1;
      bVar1 = *pbVar4;
      if (-1 < (char)bVar1) break;
      uVar8 = uVar8 | (bVar1 & 0x7f) << ((byte)uVar5 & 0x1f);
      if ((0x15 < uVar5) || (uVar5 = uVar5 + 7, pbVar4 = pbVar7, pbVar2 + sVar3 <= pbVar7))
      goto LAB_00107949;
    }
    *value = uVar8 | (uint)bVar1 << ((byte)uVar5 & 0x1f);
    pbVar6 = pbVar7;
  }
  else {
    *value = (int)(char)*pbVar2;
    pbVar6 = pbVar2 + 1;
  }
LAB_00107949:
  if (pbVar6 != (byte *)0x0) {
    input->data_ = (char *)pbVar6;
    input->size_ = (long)(pbVar2 + sVar3) - (long)pbVar6;
  }
  return pbVar6 != (byte *)0x0;
}

Assistant:

void PutVarint32(std::string* dst, uint32_t v) {
  char buf[5];
  char* ptr = EncodeVarint32(buf, v);
  dst->append(buf, ptr - buf);
}